

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

bool isOptionSet(PatternList *options,string *opt1,string *opt2)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  _Var3;
  long lVar4;
  string *local_40 [2];
  
  lVar4 = (long)opt1 - (long)options;
  local_40[0] = opt2;
  if (0 < lVar4 >> 6) {
    lVar2 = (lVar4 >> 6) + 1;
    do {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)local_40,
                           (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                            )options);
      _Var3._M_current = (shared_ptr<docopt::Pattern> *)options;
      if (bVar1) goto LAB_0012a583;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)local_40,(shared_ptr<docopt::Pattern> *)((long)options + 0x10));
      _Var3._M_current = (shared_ptr<docopt::Pattern> *)((long)options + 0x10);
      if (bVar1) goto LAB_0012a583;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)local_40,(shared_ptr<docopt::Pattern> *)((long)options + 0x20));
      _Var3._M_current = (shared_ptr<docopt::Pattern> *)((long)options + 0x20);
      if (bVar1) goto LAB_0012a583;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)local_40,(shared_ptr<docopt::Pattern> *)((long)options + 0x30));
      _Var3._M_current = (shared_ptr<docopt::Pattern> *)((long)options + 0x30);
      if (bVar1) goto LAB_0012a583;
      options = (PatternList *)((long)options + 0x40);
      lVar2 = lVar2 + -1;
      lVar4 = lVar4 + -0x40;
    } while (1 < lVar2);
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var3._M_current = (shared_ptr<docopt::Pattern> *)opt1;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                                *)local_40,
                               (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                )options), _Var3._M_current = (shared_ptr<docopt::Pattern> *)options
         , bVar1)) goto LAB_0012a583;
      options = (PatternList *)((long)options + 0x10);
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)local_40,
                         (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                          )options);
    _Var3._M_current = (shared_ptr<docopt::Pattern> *)options;
    if (bVar1) goto LAB_0012a583;
    options = (PatternList *)((long)options + 0x10);
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<isOptionSet(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                        *)local_40,
                       (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                        )options);
  _Var3._M_current = (shared_ptr<docopt::Pattern> *)options;
  if (!bVar1) {
    _Var3._M_current = (shared_ptr<docopt::Pattern> *)opt1;
  }
LAB_0012a583:
  return (string *)_Var3._M_current != opt1;
}

Assistant:

static bool isOptionSet(PatternList const& options, std::string const& opt1, std::string const& opt2 = "") {
	return std::any_of(options.begin(), options.end(), [&](std::shared_ptr<Pattern const> const& opt) -> bool {
		auto const& name = opt->name();
		if (name==opt1 || (!opt2.empty() && name==opt2)) {
			return opt->hasValue();
		}
		return false;
	});
}